

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O2

shared_ptr<duckdb::ArrowArrayWrapper,_true> __thiscall
duckdb::ArrowArrayStreamWrapper::GetNextChunk(ArrowArrayStreamWrapper *this)

{
  code *pcVar1;
  int iVar2;
  ArrowArrayWrapper *pAVar3;
  InvalidInputException *this_00;
  char *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> sVar5;
  allocator local_6a;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  make_shared_ptr<duckdb::ArrowArrayWrapper>();
  pcVar1 = *(code **)(in_RSI + 0x10);
  pAVar3 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->
                     ((shared_ptr<duckdb::ArrowArrayWrapper,_true> *)this);
  iVar2 = (*pcVar1)(in_RSI + 8,pAVar3);
  if (iVar2 == 0) {
    sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)this;
    return (shared_ptr<duckdb::ArrowArrayWrapper,_true>)
           sVar5.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_48,"arrow_scan: get_next failed(): %s",&local_69);
  pcVar4 = (char *)(**(code **)(in_RSI + 0x18))(in_RSI + 8);
  ::std::__cxx11::string::string((string *)&local_68,pcVar4,&local_6a);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<ArrowArrayWrapper> ArrowArrayStreamWrapper::GetNextChunk() {
	auto current_chunk = make_shared_ptr<ArrowArrayWrapper>();
	if (arrow_array_stream.get_next(&arrow_array_stream, &current_chunk->arrow_array)) { // LCOV_EXCL_START
		throw InvalidInputException("arrow_scan: get_next failed(): %s", string(GetError()));
	} // LCOV_EXCL_STOP

	return current_chunk;
}